

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNegativePartialUpdateTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_0::NotCurrentSurfaceTest2::iterate(NotCurrentSurfaceTest2 *this)

{
  EGLDisplay pvVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  deBool dVar6;
  EGLBoolean EVar7;
  Library *egl_00;
  EGLConfig pvVar8;
  undefined4 extraout_var;
  EGLSurface pvVar9;
  EGLSurface pvVar10;
  allocator<char> local_1c9;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  ScopedLogSection local_180;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  ScopedLogSection local_100;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  ScopedLogSection local_a8;
  undefined4 local_9c;
  EGLint EStack_98;
  int bufferAge;
  EGLint damageRegion [4];
  undefined1 local_70 [8];
  CallLogWrapper wrapper;
  TestLog *log;
  UniqueSurface dummyPbuffer;
  EGLint attribList [5];
  EGLConfig config;
  Library *egl;
  NotCurrentSurfaceTest2 *this_local;
  
  egl_00 = EglTestContext::getLibrary
                     ((this->super_NegativePartialUpdateTest).super_TestCase.m_eglTestCtx);
  pvVar8 = getEGLConfig(egl_00,(this->super_NegativePartialUpdateTest).m_eglDisplay,
                        SURFACETYPE_PBUFFER,false);
  dummyPbuffer.m_surface._0_4_ = 0x3057;
  dummyPbuffer.m_surface._4_4_ = 0x40;
  pvVar1 = (this->super_NegativePartialUpdateTest).m_eglDisplay;
  iVar4 = (*egl_00->_vptr_Library[10])(egl_00,pvVar1,pvVar8,&dummyPbuffer.m_surface);
  eglu::UniqueSurface::UniqueSurface
            ((UniqueSurface *)&log,egl_00,pvVar1,(EGLSurface)CONCAT44(extraout_var,iVar4));
  wrapper._16_8_ =
       tcu::TestContext::getLog
                 ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.
                  super_TestNode.m_testCtx);
  eglu::CallLogWrapper::CallLogWrapper((CallLogWrapper *)local_70,egl_00,(TestLog *)wrapper._16_8_);
  _EStack_98 = 0xa0000000a;
  damageRegion[0] = 10;
  damageRegion[1] = 10;
  local_9c = 0xffffffff;
  eglu::CallLogWrapper::enableLogging((CallLogWrapper *)local_70,true);
  tcu::TestContext::setTestResult
            ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  do {
    (*egl_00->_vptr_Library[0x30])
              (egl_00,(this->super_NegativePartialUpdateTest).m_eglDisplay,
               (this->super_NegativePartialUpdateTest).m_eglSurface,0x3093,0x3095);
    dVar5 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar5,
                     "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                     ,0x203);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  do {
    (*egl_00->_vptr_Library[0x2b])
              (egl_00,(this->super_NegativePartialUpdateTest).m_eglDisplay,
               (this->super_NegativePartialUpdateTest).m_eglSurface,0x313d,&local_9c);
    dVar5 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar5,
                     "querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &bufferAge)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                     ,0x204);
    dVar6 = ::deGetFalse();
    uVar2 = wrapper._16_8_;
  } while (dVar6 != 0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"Test7",&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,
             "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH"
             ,&local_f1);
  tcu::ScopedLogSection::ScopedLogSection(&local_a8,(TestLog *)uVar2,&local_c8,&local_f0);
  tcu::ScopedLogSection::~ScopedLogSection(&local_a8);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  do {
    pvVar1 = (this->super_NegativePartialUpdateTest).m_eglDisplay;
    pvVar9 = eglu::UniqueSurface::operator*((UniqueSurface *)&log);
    pvVar10 = eglu::UniqueSurface::operator*((UniqueSurface *)&log);
    (*egl_00->_vptr_Library[0x27])
              (egl_00,pvVar1,pvVar9,pvVar10,(this->super_NegativePartialUpdateTest).m_eglContext);
    dVar5 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar5,"makeCurrent(m_eglDisplay, *dummyPbuffer, *dummyPbuffer, m_eglContext)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                     ,0x208);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  EVar7 = eglu::CallLogWrapper::eglSetDamageRegionKHR
                    ((CallLogWrapper *)local_70,(this->super_NegativePartialUpdateTest).m_eglDisplay
                     ,(this->super_NegativePartialUpdateTest).m_eglSurface,&EStack_98,1);
  NegativePartialUpdateTest::expectFalse(&this->super_NegativePartialUpdateTest,EVar7);
  NegativePartialUpdateTest::expectError(&this->super_NegativePartialUpdateTest,0x3009);
  uVar2 = wrapper._16_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"Test8",&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,
             "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH"
             ,&local_149);
  tcu::ScopedLogSection::ScopedLogSection(&local_100,(TestLog *)uVar2,&local_120,&local_148);
  tcu::ScopedLogSection::~ScopedLogSection(&local_100);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  do {
    (*egl_00->_vptr_Library[0x27])(egl_00,(this->super_NegativePartialUpdateTest).m_eglDisplay,0,0);
    dVar5 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar5,
                     "makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                     ,0x20e);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  EVar7 = eglu::CallLogWrapper::eglSetDamageRegionKHR
                    ((CallLogWrapper *)local_70,(this->super_NegativePartialUpdateTest).m_eglDisplay
                     ,(this->super_NegativePartialUpdateTest).m_eglSurface,&EStack_98,1);
  NegativePartialUpdateTest::expectFalse(&this->super_NegativePartialUpdateTest,EVar7);
  NegativePartialUpdateTest::expectError(&this->super_NegativePartialUpdateTest,0x3009);
  pvVar1 = (this->super_NegativePartialUpdateTest).m_eglDisplay;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"EGL_KHR_surfaceless_context",&local_171);
  bVar3 = eglu::hasExtension(egl_00,pvVar1,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  uVar2 = wrapper._16_8_;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"Test9",&local_1a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,
               "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH"
               ,&local_1c9);
    tcu::ScopedLogSection::ScopedLogSection(&local_180,(TestLog *)uVar2,&local_1a0,&local_1c8);
    tcu::ScopedLogSection::~ScopedLogSection(&local_180);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
    do {
      (*egl_00->_vptr_Library[0x27])
                (egl_00,(this->super_NegativePartialUpdateTest).m_eglDisplay,0,0,
                 (this->super_NegativePartialUpdateTest).m_eglContext);
      dVar5 = (*egl_00->_vptr_Library[0x1f])();
      eglu::checkError(dVar5,
                       "makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, m_eglContext)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                       ,0x215);
      dVar6 = ::deGetFalse();
    } while (dVar6 != 0);
    EVar7 = eglu::CallLogWrapper::eglSetDamageRegionKHR
                      ((CallLogWrapper *)local_70,
                       (this->super_NegativePartialUpdateTest).m_eglDisplay,
                       (this->super_NegativePartialUpdateTest).m_eglSurface,&EStack_98,1);
    NegativePartialUpdateTest::expectFalse(&this->super_NegativePartialUpdateTest,EVar7);
    NegativePartialUpdateTest::expectError(&this->super_NegativePartialUpdateTest,0x3009);
  }
  eglu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_70);
  eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)&log);
  return STOP;
}

Assistant:

TestCase::IterateResult NotCurrentSurfaceTest2::iterate (void)
{
	const Library&				egl				= m_eglTestCtx.getLibrary();
	const EGLConfig				config			= getEGLConfig(egl, m_eglDisplay, SURFACETYPE_PBUFFER, false);
	const EGLint				attribList[]	=
	{
		EGL_WIDTH,	64,
		EGL_HEIGHT,	64,
		EGL_NONE
	};
	const eglu::UniqueSurface	dummyPbuffer	(egl, m_eglDisplay, egl.createPbufferSurface(m_eglDisplay, config, attribList));
	TestLog&					log				= m_testCtx.getLog();
	CallLogWrapper				wrapper			(egl, log);
	EGLint						damageRegion[]	= { 10, 10, 10, 10 };
	int							bufferAge		= -1;

	wrapper.enableLogging(true);
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED));
	EGLU_CHECK_CALL(egl, querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &bufferAge));

	{
		tcu::ScopedLogSection(log, "Test7", "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH");
		EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, *dummyPbuffer, *dummyPbuffer, m_eglContext));
		expectFalse(wrapper.eglSetDamageRegionKHR(m_eglDisplay, m_eglSurface, damageRegion, 1));
		expectError(EGL_BAD_MATCH);
	}
	{
		tcu::ScopedLogSection(log, "Test8", "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH");
		EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
		expectFalse(wrapper.eglSetDamageRegionKHR(m_eglDisplay, m_eglSurface, damageRegion, 1));
		expectError(EGL_BAD_MATCH);
	}
	if (hasExtension(egl, m_eglDisplay, "EGL_KHR_surfaceless_context"))
	{
		tcu::ScopedLogSection(log, "Test9", "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH");
		EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, m_eglContext));
		expectFalse(wrapper.eglSetDamageRegionKHR(m_eglDisplay, m_eglSurface, damageRegion, 1));
		expectError(EGL_BAD_MATCH);
	}

	return STOP;
}